

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool prvTidynodeIsTextLike(Node *node)

{
  Bool BVar1;
  Node *node_local;
  
  BVar1 = prvTidynodeIsText(node);
  if (BVar1 == no) {
    if (node->type == AspTag) {
      node_local._4_4_ = yes;
    }
    else if (node->type == PhpTag) {
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  else {
    node_local._4_4_ = yes;
  }
  return node_local._4_4_;
}

Assistant:

static Bool TY_(nodeIsTextLike)( Node *node )
{
    if ( TY_(nodeIsText)(node) )
        return yes;
    if ( node->type == AspTag )
        return yes;
    if (node->type == PhpTag)
        return yes; /* Issue #392 */
    /* add other text like nodes... */
    return no;
}